

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumHelpers.hpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
enum_to_str<FileSection>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FileSection p_enum_value,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
          *p_mapping)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
  pair;
  long *local_58;
  long local_50;
  long local_48 [2];
  _Rb_tree_color local_38;
  
  p_Var1 = (p_mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(p_mapping->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(p_Var1 + 1),
                 (long)&(p_Var1[1]._M_parent)->_M_color + *(long *)(p_Var1 + 1));
      local_38 = p_Var1[2]._M_color;
      if (local_38 == p_enum_value) {
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (pointer)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_58,local_50 + (long)local_58);
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = true;
        if (local_58 == local_48) {
          return __return_storage_ptr__;
        }
        operator_delete(local_58,local_48[0] + 1);
        return __return_storage_ptr__;
      }
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

optional<string> enum_to_str(E p_enum_value, map<string,E,ci_less> p_mapping)
{
	for(auto pair : p_mapping)
	{
		if(pair.second == p_enum_value)
		{
			return optional<string>(pair.first);
		}
	}

	return std::nullopt;
}